

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

void Omega_h::find_matches_ex<long>
               (Int deg,LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  Write<int> *this;
  Adj *this_00;
  Write<int> *this_01;
  Write<int> *this_02;
  Write<int> local_150;
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  Write<int> local_110;
  Write<int> local_100;
  Write<int> local_f0;
  Write<int> local_e0;
  Write<int> local_d0;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  if (deg == 4) {
    Write<int>::Write(&local_130,&a2fv->write_);
    this_02 = &local_140;
    Write<long>::Write(this_02,&av2v->write_);
    this_01 = &local_150;
    Write<long>::Write(this_01,&bv2v->write_);
    this_00 = &local_c0;
    Adj::Adj(this_00,v2b);
    this = &local_130;
    find_matches_deg<4,long>
              ((LOs *)this,(Read<int> *)this_02,(Read<int> *)this_01,this_00,a2b_out,codes_out,
               allow_duplicates);
  }
  else if (deg == 3) {
    Write<int>::Write(&local_100,&a2fv->write_);
    this_02 = &local_110;
    Write<long>::Write(this_02,&av2v->write_);
    this_01 = &local_120;
    Write<long>::Write(this_01,&bv2v->write_);
    this_00 = &local_90;
    Adj::Adj(this_00,v2b);
    this = &local_100;
    find_matches_deg<3,long>
              ((LOs *)this,(Read<int> *)this_02,(Read<int> *)this_01,this_00,a2b_out,codes_out,
               allow_duplicates);
  }
  else {
    if (deg != 2) {
      fail("find_matches_ex called with unsupported degree %d\n",(ulong)(uint)deg);
    }
    Write<int>::Write(&local_d0,&a2fv->write_);
    this_02 = &local_e0;
    Write<long>::Write(this_02,&av2v->write_);
    this_01 = &local_f0;
    Write<long>::Write(this_01,&bv2v->write_);
    this_00 = &local_60;
    Adj::Adj(this_00,v2b);
    this = &local_d0;
    find_matches_deg<2,long>
              ((LOs *)this,(Read<int> *)this_02,(Read<int> *)this_01,this_00,a2b_out,codes_out,
               allow_duplicates);
  }
  Adj::~Adj(this_00);
  Write<long>::~Write((Write<long> *)this_01);
  Write<long>::~Write((Write<long> *)this_02);
  Write<int>::~Write(this);
  return;
}

Assistant:

void find_matches_ex(Int const deg, LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  if (deg == 2) {
    find_matches_deg<2>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 3) {
    find_matches_deg<3>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 4) {
    find_matches_deg<4>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else {
    Omega_h_fail("find_matches_ex called with unsupported degree %d\n", deg);
  }
}